

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceMemoryBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceMemoryBase<Diligent::EngineVkImplTraits>::DeviceMemoryBase
          (DeviceMemoryBase<Diligent::EngineVkImplTraits> *this,IReferenceCounters *pRefCounters,
          RenderDeviceImplType *pDevice,DeviceMemoryCreateInfo *MemCI)

{
  RenderDeviceVkImpl *pRVar1;
  Char *Message;
  char (*in_stack_ffffffffffffff50) [35];
  size_t local_68;
  undefined1 local_60 [8];
  string msg;
  Uint64 DeviceQueuesMask;
  DeviceMemoryCreateInfo *MemCI_local;
  RenderDeviceImplType *pDevice_local;
  IReferenceCounters *pRefCounters_local;
  DeviceMemoryBase<Diligent::EngineVkImplTraits> *this_local;
  
  DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
  ::DeviceObjectBase(&this->
                      super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
                     ,pRefCounters,pDevice,&MemCI->Desc,false);
  (this->
  super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
  ).super_ObjectBase<Diligent::IDeviceMemoryVk>.super_RefCountedObject<Diligent::IDeviceMemoryVk>.
  super_IDeviceMemoryVk.super_IDeviceMemory.super_IDeviceObject.super_IObject =
       (IObject)&PTR_QueryInterface_013a27d8;
  if (MemCI->InitialSize == 0) {
    LogError<true,char[53]>
              (false,"DeviceMemoryBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceMemoryBase.hpp"
               ,0x44,(char (*) [53])"DeviceMemoryCreateInfo::InitialSize must not be zero");
  }
  pRVar1 = DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
                      );
  ValidateDeviceMemoryDesc
            (&(this->
              super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
              ).m_Desc,(IRenderDevice *)pRVar1);
  pRVar1 = DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
                      );
  msg.field_2._8_8_ =
       RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
       ::GetCommandQueueMask
                 (&pRVar1->
                   super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                 );
  if (((this->
       super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
       ).m_Desc.ImmediateContextMask & msg.field_2._8_8_) == 0) {
    pRVar1 = DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
             ::GetDevice(&this->
                          super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
                        );
    local_68 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
               ::GetCommandQueueCount
                         (&pRVar1->
                           super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                         );
    FormatString<char[42],std::ios_base&(std::ios_base&),unsigned_long,char[24],unsigned_long,char[35]>
              ((string *)local_60,(Diligent *)"No bits in the immediate context mask (0x",
               (char (*) [42])std::hex,
               (_func_ios_base_ptr_ios_base_ptr *)
               &(this->
                super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
                ).m_Desc.ImmediateContextMask,(unsigned_long *)") correspond to one of ",
               (char (*) [24])&local_68,(unsigned_long *)" available software command queues",
               in_stack_ffffffffffffff50);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"DeviceMemoryBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceMemoryBase.hpp"
               ,0x4b);
    std::__cxx11::string::~string((string *)local_60);
  }
  (this->
  super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
  ).m_Desc.ImmediateContextMask =
       msg.field_2._8_8_ &
       (this->
       super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
       ).m_Desc.ImmediateContextMask;
  return;
}

Assistant:

DeviceMemoryBase(IReferenceCounters*           pRefCounters,
                     RenderDeviceImplType*         pDevice,
                     const DeviceMemoryCreateInfo& MemCI) :
        TDeviceObjectBase{pRefCounters, pDevice, MemCI.Desc, false}
    {
        if (MemCI.InitialSize == 0)
            LOG_ERROR_AND_THROW("DeviceMemoryCreateInfo::InitialSize must not be zero");

        ValidateDeviceMemoryDesc(this->m_Desc, this->GetDevice());

        Uint64 DeviceQueuesMask = this->GetDevice()->GetCommandQueueMask();
        DEV_CHECK_ERR((this->m_Desc.ImmediateContextMask & DeviceQueuesMask) != 0,
                      "No bits in the immediate context mask (0x", std::hex, this->m_Desc.ImmediateContextMask,
                      ") correspond to one of ", this->GetDevice()->GetCommandQueueCount(), " available software command queues");
        this->m_Desc.ImmediateContextMask &= DeviceQueuesMask;
    }